

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualMappedPointerVector.hpp
# Opt level: O1

EndpointInfo * __thiscall
gmlc::containers::
DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
::find(DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
       *this,InterfaceHandle *searchValue2)

{
  __node_base_ptr p_Var1;
  _Head_base<0UL,_helics::EndpointInfo_*,_false> _Var2;
  _Hash_node_base *p_Var3;
  
  p_Var3 = (_Hash_node_base *)0x0;
  p_Var1 = std::
           _Hashtable<helics::InterfaceHandle,_std::pair<const_helics::InterfaceHandle,_unsigned_long>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::InterfaceHandle>,_std::hash<helics::InterfaceHandle>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_before_node
                     (&(this->lookup2)._M_h,
                      (ulong)(long)searchValue2->hid % (this->lookup2)._M_h._M_bucket_count,
                      searchValue2,(long)searchValue2->hid);
  if (p_Var1 != (__node_base_ptr)0x0) {
    p_Var3 = p_Var1->_M_nxt;
  }
  if (p_Var3 == (_Hash_node_base *)0x0) {
    _Var2._M_head_impl = (EndpointInfo *)0x0;
  }
  else {
    _Var2._M_head_impl =
         *(EndpointInfo **)
          &(this->dataStorage).
           super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(long)p_Var3[2]._M_nxt]._M_t.
           super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>;
  }
  return _Var2._M_head_impl;
}

Assistant:

VType* find(const searchType2& searchValue2) const
        {
            auto fnd = lookup2.find(searchValue2);
            if (fnd != lookup2.end()) {
                return dataStorage[fnd->second].get();
            }
            return nullptr;
        }